

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::cxx::GlobalAssignDescriptorsName
                   (string *__return_storage_ptr__,string *filename)

{
  string local_38;
  string *local_18;
  string *filename_local;
  
  local_18 = filename;
  filename_local = __return_storage_ptr__;
  FilenameIdentifier(&local_38,filename);
  std::operator+(__return_storage_ptr__,"protobuf_AssignDesc_",&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string GlobalAssignDescriptorsName(const string& filename) {
  return "protobuf_AssignDesc_" + FilenameIdentifier(filename);
}